

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

void append_entrance(loc_conflict grid)

{
  wchar_t wVar1;
  int *piVar2;
  dun_data *pdVar3;
  _Bool _Var4;
  loc_conflict grid2;
  loc *plVar5;
  loc lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  
  wVar1 = dun->cent_n;
  if (wVar1 < L'\x01') {
    return;
  }
  if ((uint)z_info->level_room_max < (uint)wVar1) {
    return;
  }
  uVar11 = wVar1 + L'\xffffffff';
  iVar9 = dun->ent_n[uVar11];
  if ((long)iVar9 < 0) {
    __assert_fail("dun->ent_n[ridx] >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                  ,0x74,"void append_entrance(struct loc)");
  }
  plVar5 = dun->ent[uVar11];
  if (plVar5 == (loc *)0x0) {
    plVar5 = (loc *)0x0;
  }
  else {
    grid2 = loc(-1,-1);
    _Var4 = loc_eq((loc_conflict)plVar5[iVar9],grid2);
    if (!_Var4) goto LAB_0014fe74;
    iVar9 = dun->ent_n[uVar11];
    plVar5 = dun->ent[uVar11];
  }
  uVar8 = 8;
  if (0 < iVar9) {
    uVar8 = (ulong)(uint)(iVar9 * 2);
  }
  plVar5 = (loc *)mem_realloc(plVar5,uVar8 * 8);
  dun->ent[uVar11] = plVar5;
  lVar7 = (long)dun->ent_n[uVar11];
  lVar10 = (long)((int)uVar8 + -1);
  while( true ) {
    lVar7 = lVar7 + 1;
    plVar5 = dun->ent[uVar11];
    if (lVar10 <= lVar7) break;
    lVar6 = (loc)loc(0,0);
    plVar5[lVar7] = lVar6;
  }
  lVar6 = (loc)loc(-1,-1);
  plVar5[lVar10] = lVar6;
LAB_0014fe74:
  pdVar3 = dun;
  piVar2 = dun->ent_n;
  plVar5 = dun->ent[uVar11];
  iVar9 = piVar2[uVar11];
  plVar5[iVar9].x = grid.x;
  plVar5[iVar9].y = grid.y;
  piVar2 = piVar2 + uVar11;
  *piVar2 = *piVar2 + 1;
  pdVar3->ent2room[(long)grid >> 0x20][grid.x] = uVar11;
  return;
}

Assistant:

static void append_entrance(struct loc grid)
{
	int ridx;

	if (dun->cent_n <= 0 || dun->cent_n > z_info->level_room_max) return;
	ridx = dun->cent_n - 1;
	/* Expand allocated space if needed. */
	assert(dun->ent_n[ridx] >= 0);
	if (!dun->ent[ridx] ||
			loc_eq(dun->ent[ridx][dun->ent_n[ridx]], loc(-1, -1))) {
		int alloc_n = (dun->ent_n[ridx] > 0) ?
			2 * dun->ent_n[ridx] : 8;
		int i;

		dun->ent[ridx] = mem_realloc(dun->ent[ridx],
			alloc_n * sizeof(*dun->ent[ridx]));
		for (i = dun->ent_n[ridx] + 1; i < alloc_n - 1; ++i) {
			dun->ent[ridx][i] = loc(0, 0);
		}
		/* Add sentinel to track allocated size. */
		dun->ent[ridx][alloc_n - 1] = loc(-1, -1);
	}
	/* Record the entrance */
	dun->ent[ridx][dun->ent_n[ridx]] = grid;
	++dun->ent_n[ridx];
	dun->ent2room[grid.y][grid.x] = ridx;
}